

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O0

Expression * __thiscall
wasm::Vacuum::optimize(Vacuum *this,Expression *curr,bool resultUsed,bool typeMatters)

{
  Vacuum *pVVar1;
  bool bVar2;
  PassOptions *pPVar3;
  Module *pMVar4;
  size_t sVar5;
  Expression **ppEVar6;
  Expression *pEVar7;
  Iterator IVar8;
  bool local_449;
  Literals local_438;
  Builder local_400;
  Expression *local_3f8;
  Expression *dummy;
  Expression *local_280;
  Expression *child;
  Index local_270;
  undefined1 local_268 [8];
  Iterator __end3;
  undefined1 local_248 [8];
  Iterator __begin3;
  ChildIterator *__range3;
  SmallVector<wasm::Expression_*,_1UL> childrenWithEffects;
  undefined1 local_1b8 [8];
  EffectAnalyzer self;
  Expression *prev;
  BasicType local_38 [2];
  Type local_30;
  Type type;
  bool typeMatters_local;
  Vacuum *pVStack_20;
  bool resultUsed_local;
  Expression *curr_local;
  Vacuum *this_local;
  
  local_30.id = (curr->type).id;
  local_38[1] = 0;
  type.id._6_1_ = typeMatters;
  type.id._7_1_ = resultUsed;
  bVar2 = wasm::Type::operator==(&local_30,local_38 + 1);
  if (bVar2) {
    type.id._6_1_ = 1;
  }
  local_38[0] = unreachable;
  bVar2 = wasm::Type::operator==(&local_30,local_38);
  pVVar1 = (Vacuum *)curr;
  if (!bVar2) {
    local_449 = true;
    if ((type.id._7_1_ & 1) != 0) {
      prev._4_4_ = 0;
      local_449 = wasm::Type::operator!=(&curr->type,(BasicType *)((long)&prev + 4));
    }
    if (local_449 == false) {
      __assert_fail("!resultUsed || curr->type != Type::none",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Vacuum.cpp"
                    ,0x60,"Expression *wasm::Vacuum::optimize(Expression *, bool, bool)");
    }
    self.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)curr;
    pVStack_20 = (Vacuum *)curr;
    pVVar1 = (Vacuum *)curr;
    if ((type.id._7_1_ & 1) == 0) {
      do {
        if (((type.id._6_1_ & 1) != 0) &&
           (bVar2 = wasm::Type::operator!=
                              ((Type *)&(pVStack_20->
                                        super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                        ).super_Pass.runner,&local_30), bVar2)) {
          return (Expression *)self.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
          ;
        }
        self.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pVStack_20;
        bVar2 = Expression::is<wasm::Drop>((Expression *)pVStack_20);
        if ((((bVar2) || (bVar2 = Expression::is<wasm::Block>((Expression *)pVStack_20), bVar2)) ||
            (bVar2 = Expression::is<wasm::If>((Expression *)pVStack_20), bVar2)) ||
           ((bVar2 = Expression::is<wasm::Loop>((Expression *)pVStack_20), bVar2 ||
            (bVar2 = Expression::is<wasm::Try>((Expression *)pVStack_20), bVar2)))) {
          return (Expression *)pVStack_20;
        }
        pPVar3 = Pass::getPassOptions((Pass *)this);
        pMVar4 = Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::getModule
                           ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                            &(this->
                             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                             ).
                             super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                           );
        EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)local_1b8,pPVar3,pMVar4);
        EffectAnalyzer::visit((EffectAnalyzer *)local_1b8,(Expression *)pVStack_20);
        bVar2 = EffectAnalyzer::hasUnremovableSideEffects((EffectAnalyzer *)local_1b8);
        if (bVar2) {
          this_local = pVStack_20;
          childrenWithEffects.flexible.
          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        else {
          SmallVector<wasm::Expression_*,_1UL>::SmallVector
                    ((SmallVector<wasm::Expression_*,_1UL> *)&__range3);
          ChildIterator::ChildIterator((ChildIterator *)&__begin3.index,(Expression *)pVStack_20);
          IVar8 = AbstractChildIterator<wasm::ChildIterator>::begin
                            ((AbstractChildIterator<wasm::ChildIterator> *)&__begin3.index);
          __end3._8_8_ = IVar8.parent;
          __begin3.parent._0_4_ = IVar8.index;
          local_248 = (undefined1  [8])__end3._8_8_;
          IVar8 = AbstractChildIterator<wasm::ChildIterator>::end
                            ((AbstractChildIterator<wasm::ChildIterator> *)&__begin3.index);
          child = (Expression *)IVar8.parent;
          local_270 = IVar8.index;
          local_268 = (undefined1  [8])child;
          __end3.parent._0_4_ = local_270;
          while (bVar2 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator!=
                                   ((Iterator *)local_248,(Iterator *)local_268), bVar2) {
            ppEVar6 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                                ((Iterator *)local_248);
            local_280 = *ppEVar6;
            pPVar3 = Pass::getPassOptions((Pass *)this);
            pMVar4 = Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::getModule
                               ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                                &(this->
                                 super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                 ).
                                 super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                               );
            EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)&dummy,pPVar3,pMVar4,local_280);
            bVar2 = EffectAnalyzer::hasUnremovableSideEffects((EffectAnalyzer *)&dummy);
            EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&dummy);
            if (bVar2) {
              SmallVector<wasm::Expression_*,_1UL>::push_back
                        ((SmallVector<wasm::Expression_*,_1UL> *)&__range3,&local_280);
            }
            AbstractChildIterator<wasm::ChildIterator>::Iterator::operator++((Iterator *)local_248);
          }
          childrenWithEffects.flexible.
          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 4;
          ChildIterator::~ChildIterator((ChildIterator *)&__begin3.index);
          bVar2 = SmallVector<wasm::Expression_*,_1UL>::empty
                            ((SmallVector<wasm::Expression_*,_1UL> *)&__range3);
          if (bVar2) {
            this_local = (Vacuum *)0x0;
            childrenWithEffects.flexible.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          }
          else {
            sVar5 = SmallVector<wasm::Expression_*,_1UL>::size
                              ((SmallVector<wasm::Expression_*,_1UL> *)&__range3);
            if (sVar5 == 1) {
              ppEVar6 = SmallVector<wasm::Expression_*,_1UL>::operator[]
                                  ((SmallVector<wasm::Expression_*,_1UL> *)&__range3,0);
              pVStack_20 = (Vacuum *)*ppEVar6;
              childrenWithEffects.flexible.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
            }
            else {
              bVar2 = wasm::Type::isDefaultable
                                ((Type *)&(pVStack_20->
                                          super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                          ).super_Pass.runner);
              if (bVar2) {
                pMVar4 = Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::getModule
                                   ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                                    &(this->
                                     super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                     ).
                                     super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                   );
                Builder::Builder(&local_400,pMVar4);
                wasm::Literal::makeZeros
                          (&local_438,
                           (Type)((Type *)&(pVStack_20->
                                           super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                           ).super_Pass.runner)->id);
                pEVar7 = Builder::makeConstantExpression(&local_400,&local_438);
                Literals::~Literals(&local_438);
                local_3f8 = pEVar7;
                pMVar4 = Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::getModule
                                   ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                                    &(this->
                                     super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                     ).
                                     super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                   );
                pPVar3 = Pass::getPassOptions((Pass *)this);
                this_local = (Vacuum *)
                             getDroppedChildrenAndAppend
                                       ((Expression *)pVStack_20,pMVar4,pPVar3,local_3f8);
                childrenWithEffects.flexible.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
              }
              else {
                this_local = pVStack_20;
                childrenWithEffects.flexible.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
              }
            }
          }
          SmallVector<wasm::Expression_*,_1UL>::~SmallVector
                    ((SmallVector<wasm::Expression_*,_1UL> *)&__range3);
        }
        EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_1b8);
        pVVar1 = this_local;
      } while ((int)childrenWithEffects.flexible.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage != 1);
    }
  }
  this_local = pVVar1;
  return (Expression *)this_local;
}

Assistant:

Expression* optimize(Expression* curr, bool resultUsed, bool typeMatters) {
    auto type = curr->type;
    // If the type is none, then we can never replace it with another type.
    if (type == Type::none) {
      typeMatters = true;
    }
    // An unreachable node must not be changed. DCE will remove those.
    if (type == Type::unreachable) {
      return curr;
    }
    // resultUsed only makes sense when the type is concrete
    assert(!resultUsed || curr->type != Type::none);
    // If we actually need the result, then we must not change anything.
    // TODO: maybe there is something clever though?
    if (resultUsed) {
      return curr;
    }
    // We iterate on possible replacements.
    auto* prev = curr;
    while (1) {
      // If a replacement changes the type, and the type matters, return the
      // previous one and stop.
      if (typeMatters && curr->type != type) {
        return prev;
      }
      prev = curr;
      // Some instructions have special handling in visit*, and we should do
      // nothing for them here.
      if (curr->is<Drop>() || curr->is<Block>() || curr->is<If>() ||
          curr->is<Loop>() || curr->is<Try>()) {
        return curr;
      }
      // Check if this expression itself has side effects, ignoring children.
      EffectAnalyzer self(getPassOptions(), *getModule());
      self.visit(curr);
      if (self.hasUnremovableSideEffects()) {
        return curr;
      }
      // The result isn't used, and this has no side effects itself, so we can
      // get rid of it. However, the children may have side effects.
      SmallVector<Expression*, 1> childrenWithEffects;
      for (auto* child : ChildIterator(curr)) {
        if (EffectAnalyzer(getPassOptions(), *getModule(), child)
              .hasUnremovableSideEffects()) {
          childrenWithEffects.push_back(child);
        }
      }
      if (childrenWithEffects.empty()) {
        return nullptr;
      }
      if (childrenWithEffects.size() == 1) {
        // We know the result isn't used, and curr has no side effects, so we
        // can skip curr and keep looking into the child.
        curr = childrenWithEffects[0];
        continue;
      }
      // The result is not used, but multiple children have side effects, so we
      // need to keep them around. We must also return something of the proper
      // type - if we can do that, replace everything with the children + a
      // dummy value of the proper type.
      if (curr->type.isDefaultable()) {
        auto* dummy = Builder(*getModule())
                        .makeConstantExpression(Literal::makeZeros(curr->type));
        return getDroppedChildrenAndAppend(
          curr, *getModule(), getPassOptions(), dummy);
      }
      // Otherwise, give up.
      return curr;
    }
  }